

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

shared_ptr<duckdb::ColumnData,_true> __thiscall
duckdb::ColumnData::CreateColumn
          (ColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index,
          idx_t start_row,LogicalType *type,optional_ptr<duckdb::ColumnData,_true> parent)

{
  PhysicalType PVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::StructColumnData,_true> sVar3;
  shared_ptr<duckdb::ArrayColumnData,_true> sVar4;
  shared_ptr<duckdb::ListColumnData,_true> sVar5;
  shared_ptr<duckdb::ValidityColumnData,_true> sVar6;
  shared_ptr<duckdb::StandardColumnData,_true> sVar7;
  shared_ptr<duckdb::ColumnData,_true> sVar8;
  idx_t local_50;
  idx_t local_48;
  optional_ptr<duckdb::ColumnData,_true> local_40;
  _func_int **local_38;
  idx_t iStack_30;
  
  local_40.ptr = parent.ptr;
  PVar1 = type->physical_type_;
  local_50 = start_row;
  local_48 = column_index;
  if (PVar1 == LIST) {
    sVar5 = SharedConstructor::
            Create<duckdb::ListColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
                      ((SharedConstructor *)&local_38,block_manager,info,&local_48,&local_50,type,
                       &local_40);
    _Var2._M_pi = sVar5.internal.
                  super___shared_ptr<duckdb::ListColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
  }
  else if (PVar1 == ARRAY) {
    sVar4 = SharedConstructor::
            Create<duckdb::ArrayColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
                      ((SharedConstructor *)&local_38,block_manager,info,&local_48,&local_50,type,
                       &local_40);
    _Var2._M_pi = sVar4.internal.
                  super___shared_ptr<duckdb::ArrayColumnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else if (PVar1 == STRUCT) {
    sVar3 = SharedConstructor::
            Create<duckdb::StructColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
                      ((SharedConstructor *)&local_38,block_manager,info,&local_48,&local_50,type,
                       &local_40);
    _Var2._M_pi = sVar3.internal.
                  super___shared_ptr<duckdb::StructColumnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else if (type->id_ == VALIDITY) {
    optional_ptr<duckdb::ColumnData,_true>::CheckValid(&local_40);
    sVar6 = SharedConstructor::
            Create<duckdb::ValidityColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::ColumnData&>
                      ((SharedConstructor *)&local_38,block_manager,info,&local_48,&local_50,
                       local_40.ptr);
    _Var2._M_pi = sVar6.internal.
                  super___shared_ptr<duckdb::ValidityColumnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    sVar7 = SharedConstructor::
            Create<duckdb::StandardColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
                      ((SharedConstructor *)&local_38,block_manager,info,&local_48,&local_50,type,
                       &local_40);
    _Var2._M_pi = sVar7.internal.
                  super___shared_ptr<duckdb::StandardColumnData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  this->_vptr_ColumnData = local_38;
  this->start = iStack_30;
  sVar8.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar8.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::ColumnData,_true>)
         sVar8.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnData> ColumnData::CreateColumn(BlockManager &block_manager, DataTableInfo &info, idx_t column_index,
                                                idx_t start_row, const LogicalType &type,
                                                optional_ptr<ColumnData> parent) {
	return CreateColumnInternal<shared_ptr<ColumnData>, SharedConstructor>(block_manager, info, column_index, start_row,
	                                                                       type, parent);
}